

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# changesoplex.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeLhs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int i,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *newLhs,bool scale)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  pointer pnVar4;
  bool bVar5;
  undefined7 in_register_00000009;
  long lVar6;
  long lVar7;
  uint *puVar8;
  pointer pnVar9;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  uint *puVar11;
  undefined4 *puVar12;
  byte bVar13;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  uint local_130 [28];
  int local_c0;
  undefined1 local_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 local_b0 [28];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar13 = 0;
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar4 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar8 = (uint *)(pnVar4 + i);
    puVar11 = (uint *)&local_1b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar11 = *puVar8;
      puVar8 = puVar8 + 1;
      puVar11 = puVar11 + 1;
    }
    local_1b0.m_backend.exp = pnVar4[i].m_backend.exp;
    local_1b0.m_backend.neg = pnVar4[i].m_backend.neg;
    local_1b0.m_backend.fpclass = pnVar4[i].m_backend.fpclass;
    local_1b0.m_backend.prec_elem = pnVar4[i].m_backend.prec_elem;
  }
  else {
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::lhsUnscaled(&local_1b0,
                  &this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,i);
  }
  bVar5 = boost::multiprecision::operator!=(newLhs,&local_1b0);
  if (bVar5) {
    forceRecompNonbasicValue(this);
    pnVar4 = (this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar9 = pnVar4 + i;
    pnVar10 = &local_1b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
      pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
    }
    iVar3 = pnVar4[i].m_backend.exp;
    bVar5 = pnVar4[i].m_backend.neg;
    uVar1 = pnVar4[i].m_backend.fpclass;
    uVar2 = pnVar4[i].m_backend.prec_elem;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::changeLhs(&this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ,i,newLhs,scale);
    if (NO_PROBLEM <
        (this->
        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thestatus) {
      pnVar4 = (this->
               super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .left.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar6 = 0x1c;
      pnVar9 = pnVar4 + i;
      puVar12 = local_b0;
      for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar12 = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar13 * -2 + 1) * 4);
        puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
      }
      local_40 = pnVar4[i].m_backend.exp;
      local_3c = pnVar4[i].m_backend.neg;
      local_38._0_4_ = pnVar4[i].m_backend.fpclass;
      local_38._4_4_ = pnVar4[i].m_backend.prec_elem;
      pnVar10 = &local_1b0;
      puVar8 = local_130;
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        *puVar8 = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar10 + ((ulong)bVar13 * -2 + 1) * 4);
        puVar8 = puVar8 + (ulong)bVar13 * -2 + 1;
      }
      local_b8 = uVar1;
      uStack_b4 = uVar2;
      local_c0 = iVar3;
      local_bc = bVar5;
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x6b])(this,i,local_b0,local_130);
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x77])(this);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::changeLhs(int i, const R& newLhs, bool scale)
{
   if(newLhs != (scale ? this->lhsUnscaled(i) : this->lhs(i)))
   {
      forceRecompNonbasicValue();

      R oldLhs = this->lhs(i);
      SPxLPBase<R>::changeLhs(i, newLhs, scale);

      if(SPxBasisBase<R>::status() > SPxBasisBase<R>::NO_PROBLEM)
      {
         changeLhsStatus(i, this->lhs(i), oldLhs);
         unInit();
      }
   }
}